

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteStream.c
# Opt level: O0

sysbvm_tuple_t sysbvm_byteStream_asByteArray(sysbvm_context_t *context,sysbvm_tuple_t byteStream)

{
  _Bool _Var1;
  sysbvm_size_t size_00;
  sysbvm_object_tuple_t *storage;
  sysbvm_object_tuple_t *result;
  size_t size;
  sysbvm_byteStream_t *byteStreamObject;
  sysbvm_tuple_t byteStream_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(byteStream);
  if (_Var1) {
    size_00 = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(byteStream + 0x10));
    context_local = (sysbvm_context_t *)sysbvm_byteArray_create(context,size_00);
    memcpy(&(context_local->heap).shouldAttemptToCollect,
           (void *)(*(long *)(byteStream + 0x18) + 0x10),size_00);
  }
  else {
    context_local = (sysbvm_context_t *)0x0;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_byteStream_asByteArray(sysbvm_context_t *context, sysbvm_tuple_t byteStream)
{
    if(!sysbvm_tuple_isNonNullPointer(byteStream))
        return SYSBVM_NULL_TUPLE;

    sysbvm_byteStream_t *byteStreamObject = (sysbvm_byteStream_t*)byteStream;
    size_t size = sysbvm_tuple_size_decode(byteStreamObject->size);
    sysbvm_object_tuple_t *result = (sysbvm_object_tuple_t*)sysbvm_byteArray_create(context, size);
    sysbvm_object_tuple_t *storage = (sysbvm_object_tuple_t*)byteStreamObject->storage;
    memcpy(result->bytes, storage->bytes, size);
    return (sysbvm_tuple_t)result;
}